

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall NDeviceChannel::~NDeviceChannel(NDeviceChannel *this)

{
  ~NDeviceChannel(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

NDeviceChannel::~NDeviceChannel() {

}